

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O2

QVariant *
parseHeaderValue(QVariant *__return_storage_ptr__,KnownHeaders header,QByteArrayView value)

{
  QVariant *pQVar1;
  bool ok;
  QUrl result;
  
  pQVar1 = (QVariant *)
           (*(code *)(&DAT_00241070 + *(int *)(&DAT_00241070 + (ulong)header * 4)))
                     (__return_storage_ptr__,&DAT_00241070,value.m_size,value.m_data);
  return pQVar1;
}

Assistant:

static QVariant parseHeaderValue(QNetworkRequest::KnownHeaders header, QByteArrayView value)
{
    // header is always a valid value
    switch (header) {
    case QNetworkRequest::UserAgentHeader:
    case QNetworkRequest::ServerHeader:
    case QNetworkRequest::ContentTypeHeader:
    case QNetworkRequest::ContentDispositionHeader:
        // copy exactly, convert to QString
        return QString::fromLatin1(value);

    case QNetworkRequest::ContentLengthHeader: {
        bool ok;
        qint64 result = QByteArrayView(value).trimmed().toLongLong(&ok);
        if (ok)
            return result;
        return QVariant();
    }

    case QNetworkRequest::LocationHeader: {
        QUrl result = QUrl::fromEncoded(value, QUrl::StrictMode);
        if (result.isValid() && !result.scheme().isEmpty())
            return result;
        return QVariant();
    }

    case QNetworkRequest::LastModifiedHeader:
    case QNetworkRequest::IfModifiedSinceHeader:
        return parseHttpDate(value);

    case QNetworkRequest::ETagHeader:
        return parseETag(value);

    case QNetworkRequest::IfMatchHeader:
        return parseIfMatch(value);

    case QNetworkRequest::IfNoneMatchHeader:
        return parseIfNoneMatch(value);

    case QNetworkRequest::CookieHeader:
        return QVariant::fromValue(parseCookieHeader(value));

    case QNetworkRequest::SetCookieHeader:
        return QVariant::fromValue(QNetworkCookie::parseCookies(value));

    default:
        Q_UNREACHABLE_RETURN({});
    }
}